

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<unsigned_char> *
testing::internal::ActionResultHolder<unsigned_char>::PerformAction<unsigned_char(unsigned_short)>
          (Action<unsigned_char_(unsigned_short)> *action,ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<unsigned_char> *pAVar2;
  _Head_base<0UL,_unsigned_short,_false> local_1a;
  
  pAVar2 = (ActionResultHolder<unsigned_char> *)operator_new(0x10);
  local_1a._M_head_impl =
       (args->super__Tuple_impl<0UL,_unsigned_short>).super__Head_base<0UL,_unsigned_short,_false>.
       _M_head_impl;
  RVar1 = Action<unsigned_char_(unsigned_short)>::Perform(action,(ArgumentTuple *)&local_1a);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002a0c48;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }